

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O2

ze_result_t validation_layer::zesPowerSetEnergyThreshold(zes_pwr_handle_t hPower,double threshold)

{
  Logger *this;
  code *pcVar1;
  long *plVar2;
  long lVar3;
  ze_result_t result;
  ze_result_t zVar4;
  size_t i;
  long lVar5;
  long lVar6;
  size_t i_1;
  allocator local_59;
  double local_58;
  string local_50;
  
  lVar3 = context;
  this = *(Logger **)(context + 0xd50);
  local_58 = threshold;
  std::__cxx11::string::string
            ((string *)&local_50,"zesPowerSetEnergyThreshold(hPower, threshold)",&local_59);
  loader::Logger::log_trace(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pcVar1 = *(code **)(lVar3 + 0xac8);
  if (pcVar1 == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar6 = *(long *)(lVar3 + 0xd38) - *(long *)(lVar3 + 0xd30) >> 3;
    lVar5 = 0;
    do {
      if (lVar6 == lVar5) {
        if ((*(char *)(lVar3 + 4) != '\x01') ||
           (result = ZESHandleLifetimeValidation::zesPowerSetEnergyThresholdPrologue
                               ((ZESHandleLifetimeValidation *)(*(long *)(lVar3 + 0xd48) + 8),hPower
                                ,local_58), result == ZE_RESULT_SUCCESS)) {
          zVar4 = (*pcVar1)(local_58,hPower);
          lVar5 = 0;
          goto LAB_0017064e;
        }
        break;
      }
      plVar2 = *(long **)(*(long *)(*(long *)(lVar3 + 0xd30) + lVar5 * 8) + 8);
      result = (**(code **)(*plVar2 + 0x660))(local_58,plVar2,hPower);
      lVar5 = lVar5 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_00170680;
  while( true ) {
    plVar2 = *(long **)(*(long *)(*(long *)(lVar3 + 0xd30) + lVar5 * 8) + 8);
    result = (**(code **)(*plVar2 + 0x668))(local_58,plVar2,hPower,zVar4);
    lVar5 = lVar5 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_0017064e:
    result = zVar4;
    if (lVar6 == lVar5) break;
  }
LAB_00170680:
  logAndPropagateResult("zesPowerSetEnergyThreshold",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesPowerSetEnergyThreshold(
        zes_pwr_handle_t hPower,                        ///< [in] Handle for the component.
        double threshold                                ///< [in] The energy threshold to be set in joules.
        )
    {
        context.logger->log_trace("zesPowerSetEnergyThreshold(hPower, threshold)");

        auto pfnSetEnergyThreshold = context.zesDdiTable.Power.pfnSetEnergyThreshold;

        if( nullptr == pfnSetEnergyThreshold )
            return logAndPropagateResult("zesPowerSetEnergyThreshold", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesPowerSetEnergyThresholdPrologue( hPower, threshold );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesPowerSetEnergyThreshold", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zesHandleLifetime.zesPowerSetEnergyThresholdPrologue( hPower, threshold );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesPowerSetEnergyThreshold", result);
        }

        auto driver_result = pfnSetEnergyThreshold( hPower, threshold );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesPowerSetEnergyThresholdEpilogue( hPower, threshold ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesPowerSetEnergyThreshold", result);
        }

        return logAndPropagateResult("zesPowerSetEnergyThreshold", driver_result);
    }